

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void decode(string *path)

{
  FILE *__stream;
  long lVar1;
  ulong uVar2;
  uchar *__ptr;
  int k;
  uint uVar3;
  int height;
  int width;
  uchar *local_b0;
  ulong local_a8;
  uchar *occurences;
  int maximum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string newPath;
  string local_50;
  
  width = 0;
  height = 0;
  maximum = 0;
  std::__cxx11::string::string((string *)&local_50,(string *)path);
  local_b0 = readEncoded(&local_50,&occurences,&width,&height,&maximum);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::substr((ulong)&local_90,(ulong)path);
  std::operator+(&newPath,&local_90,"_decoded.ppm");
  std::__cxx11::string::~string((string *)&local_90);
  __stream = fopen(newPath._M_dataplus._M_p,"wb");
  fprintf(__stream,"P6\n%d %d\n255\n",(ulong)(uint)width,(ulong)(uint)height);
  lVar1 = 0;
  uVar2 = 0;
  while ((int)uVar2 < height * width) {
    __ptr = local_b0 + lVar1 * 3;
    local_a8 = uVar2;
    for (uVar3 = 0; uVar3 < occurences[lVar1]; uVar3 = uVar3 + 1) {
      fwrite(__ptr,1,3,__stream);
    }
    lVar1 = lVar1 + 1;
    uVar2 = (ulong)((int)local_a8 + uVar3);
  }
  fclose(__stream);
  std::__cxx11::string::~string((string *)&newPath);
  return;
}

Assistant:

void decode(std::string path)
{
    int width = 0;		// width of the image
    int height = 0;		// heigt of the image
    int maximum = 0;	// maximum pixel value

    unsigned char* occurences;
    unsigned char* encodedPixels = readEncoded(path, &occurences, width, height, maximum);

    string newPath = path.substr(0, path.size()-4) + "_decoded.ppm";
    FILE *fp = fopen(newPath.c_str(), "wb");
    fprintf(fp, "P6\n%d %d\n255\n", width, height);
    int pixelCounter = 0;
    for (int i = 0; i < width*height; )
    {
        for (int k = 0; k < occurences[pixelCounter]; k++)
        {
            fwrite(&encodedPixels[pixelCounter*3], 1, 3, fp);
            i++;        // we wrote one pixel
        }
        pixelCounter++;
    }
    fclose(fp);
}